

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O0

void __thiscall
JsrtDebugManager::CallDebugEventCallback
          (JsrtDebugManager *this,JsDiagDebugEvent debugEvent,DynamicObject *eventDataObject,
          ScriptContext *scriptContext,bool isBreak)

{
  bool bVar1;
  ThreadContext *pTVar2;
  undefined1 local_90 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  void *__frameAddr;
  anon_class_32_4_c0da80a4 funcPtr;
  bool isBreak_local;
  ScriptContext *scriptContext_local;
  DynamicObject *eventDataObject_local;
  JsrtDebugManager *pJStack_10;
  JsDiagDebugEvent debugEvent_local;
  JsrtDebugManager *this_local;
  
  __frameAddr = (void *)((long)&funcPtr.eventDataObject + 7);
  funcPtr.this = (JsrtDebugManager *)((long)&eventDataObject_local + 4);
  funcPtr.debugEvent = (JsDiagDebugEvent *)&scriptContext_local;
  funcPtr.isBreak = (bool *)this;
  funcPtr.eventDataObject._7_1_ = isBreak;
  scriptContext_local = (ScriptContext *)eventDataObject;
  eventDataObject_local._4_4_ = debugEvent;
  pJStack_10 = this;
  pTVar2 = Js::ScriptContext::GetThreadContext(scriptContext);
  bVar1 = ThreadContext::IsScriptActive(pTVar2);
  if (bVar1) {
    Js::LeaveScriptObject<true,_true,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)
               &autoReentrancyHandler.m_savedReentrancySafeOrHandled,scriptContext,&this_local);
    pTVar2 = Js::ScriptContext::GetThreadContext(scriptContext);
    AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_90,pTVar2);
    CallDebugEventCallback::anon_class_32_4_c0da80a4::operator()
              ((anon_class_32_4_c0da80a4 *)&__frameAddr);
    if (scriptContext != (ScriptContext *)0x0) {
      pTVar2 = Js::ScriptContext::GetThreadContext(scriptContext);
      ThreadContext::DisposeOnLeaveScript(pTVar2);
    }
    AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_90);
    Js::LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)
               &autoReentrancyHandler.m_savedReentrancySafeOrHandled);
  }
  else {
    CallDebugEventCallback::anon_class_32_4_c0da80a4::operator()
              ((anon_class_32_4_c0da80a4 *)&__frameAddr);
  }
  return;
}

Assistant:

void JsrtDebugManager::CallDebugEventCallback(JsDiagDebugEvent debugEvent, Js::DynamicObject* eventDataObject, Js::ScriptContext* scriptContext, bool isBreak)
{
    class AutoClear
    {
    public:
        AutoClear(JsrtDebugManager* jsrtDebug, void* dispatchHaltFrameAddress)
        {
            this->jsrtDebugManager = jsrtDebug;
            this->jsrtDebugManager->GetThreadContext()->GetDebugManager()->SetDispatchHaltFrameAddress(dispatchHaltFrameAddress);
        }

        ~AutoClear()
        {
            if (jsrtDebugManager->debuggerObjectsManager != nullptr)
            {
                jsrtDebugManager->GetDebuggerObjectsManager()->ClearAll();
            }

            if (jsrtDebugManager->stackFrames != nullptr)
            {
                Adelete(jsrtDebugManager->GetDebugObjectArena(), jsrtDebugManager->stackFrames);
                jsrtDebugManager->stackFrames = nullptr;
            }
            this->jsrtDebugManager->GetThreadContext()->GetDebugManager()->SetDispatchHaltFrameAddress(nullptr);
            this->jsrtDebugManager = nullptr;
        }
    private:
        JsrtDebugManager* jsrtDebugManager;
    };

    auto funcPtr = [&]()
    {
        if (isBreak)
        {
            void *frameAddress = _AddressOfReturnAddress();
            // If we are reporting break we should clear all objects after call returns

            // Save the frame address, when asking for stack we will only give stack which is under this address
            // because host can execute javascript after break which should not be part of stack.
            AutoClear autoClear(this, frameAddress);
            this->debugEventCallback(debugEvent, eventDataObject, this->callbackState);
        }
        else
        {
            this->debugEventCallback(debugEvent, eventDataObject, this->callbackState);
        }
    };

    if (scriptContext->GetThreadContext()->IsScriptActive())
    {
        BEGIN_LEAVE_SCRIPT(scriptContext)
        {
            funcPtr();
        }
        END_LEAVE_SCRIPT(scriptContext);
    }
    else
    {
        funcPtr();
    }
}